

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_KDReportsPreviewWidget.cpp
# Opt level: O1

void KDReports::PreviewWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  undefined8 *puVar4;
  QMetaTypeInterface *pQVar5;
  int iVar6;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c != IndexOfMethod) {
      if (_c != InvokeMetaMethod) {
        return;
      }
      switch(_id) {
      case 0:
        local_10 = (undefined4 *)_a[1];
        iVar6 = 0;
        break;
      case 1:
        local_1c = *_a[1];
        local_10 = &local_1c;
        iVar6 = 1;
        break;
      case 2:
        QMetaObject::activate(_o,&staticMetaObject,2,(void **)0x0);
        return;
      case 3:
        local_10 = (undefined4 *)_a[1];
        iVar6 = 3;
        break;
      default:
        return;
      }
      local_18 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_18);
      return;
    }
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == pageSizeChanged && lVar3 == 0) {
      *puVar1 = 0;
      return;
    }
    if (pcVar2 == orientationChanged && lVar3 == 0) {
      *puVar1 = 1;
      return;
    }
    if (pcVar2 == tableSettingsClicked && lVar3 == 0) {
      *puVar1 = 2;
      return;
    }
    if (pcVar2 != linkActivated || lVar3 != 0) {
      return;
    }
    *puVar1 = 3;
    return;
  }
  if (_id == 0) {
    puVar4 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pQVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QPageSize>::metaType;
LAB_0012861e:
      *puVar4 = pQVar5;
      return;
    }
  }
  else if (_id == 1) {
    puVar4 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pQVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QPageLayout::Orientation>::metaType;
      goto LAB_0012861e;
    }
  }
  else {
    puVar4 = (undefined8 *)*_a;
  }
  *puVar4 = 0;
  return;
}

Assistant:

void KDReports::PreviewWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PreviewWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->pageSizeChanged((*reinterpret_cast< std::add_pointer_t<QPageSize>>(_a[1]))); break;
        case 1: _t->orientationChanged((*reinterpret_cast< std::add_pointer_t<QPageLayout::Orientation>>(_a[1]))); break;
        case 2: _t->tableSettingsClicked(); break;
        case 3: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QPageSize >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QPageLayout::Orientation >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PreviewWidget::*)(const QPageSize & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PreviewWidget::pageSizeChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (PreviewWidget::*)(QPageLayout::Orientation );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PreviewWidget::orientationChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (PreviewWidget::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PreviewWidget::tableSettingsClicked)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (PreviewWidget::*)(const QUrl & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PreviewWidget::linkActivated)) {
                *result = 3;
                return;
            }
        }
    }
}